

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O3

parasail_profile_t *
parasail_profile_create_sse_128_8(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  undefined1 uVar4;
  int iVar5;
  void *pvVar6;
  parasail_profile_t *ppVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  __m128i_8_t t;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_sse_128_8_cold_2();
  }
  else if (s1 == (char *)0x0 && matrix->type == 0) {
    parasail_profile_create_sse_128_8_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar2 = matrix->size;
    iVar13 = _s1Len + 0x1e;
    if (-1 < _s1Len + 0xf) {
      iVar13 = _s1Len + 0xf;
    }
    uVar10 = iVar13 >> 4;
    pvVar6 = parasail_memalign(0x10,(long)(int)(uVar10 * uVar2) << 4);
    if ((pvVar6 != (void *)0x0) &&
       (ppVar7 = parasail_profile_new(s1,_s1Len,matrix), ppVar7 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar2) {
        uVar8 = 1;
        if (1 < (int)uVar10) {
          uVar8 = (ulong)uVar10;
        }
        uVar11 = 0;
        lVar12 = 0;
        do {
          if (0 < _s1Len) {
            lVar12 = (long)(int)lVar12;
            iVar13 = 0;
            uVar15 = 0;
            do {
              iVar3 = matrix->type;
              lVar9 = 0;
              uVar14 = uVar15;
              iVar16 = iVar13;
              do {
                if (iVar3 == 0) {
                  if ((int)uVar14 < _s1Len) {
                    iVar5 = matrix->mapper[(byte)s1[uVar14]] + (int)uVar11 * uVar2;
                    goto LAB_005aa2a8;
                  }
LAB_005aa2b4:
                  uVar4 = 0;
                }
                else {
                  if (_s1Len <= (int)uVar14) goto LAB_005aa2b4;
                  iVar5 = matrix->mapper[(byte)matrix->alphabet[uVar11]] + iVar16;
LAB_005aa2a8:
                  uVar4 = (undefined1)matrix->matrix[iVar5];
                }
                *(undefined1 *)((long)&local_48 + lVar9) = uVar4;
                uVar14 = uVar14 + uVar10;
                lVar9 = lVar9 + 1;
                iVar16 = iVar16 + uVar10 * uVar2;
              } while (lVar9 != 0x10);
              puVar1 = (undefined8 *)((long)pvVar6 + lVar12 * 0x10);
              *puVar1 = local_48;
              puVar1[1] = uStack_40;
              lVar12 = lVar12 + 1;
              uVar15 = uVar15 + 1;
              iVar13 = iVar13 + uVar2;
            } while (uVar15 != uVar8);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar2);
      }
      (ppVar7->profile8).score = pvVar6;
      ppVar7->free = parasail_free___m128i;
      return ppVar7;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_sse_128_8(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 16; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_8_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile8.score = vProfile;
    profile->free = &parasail_free___m128i;
    return profile;
}